

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O1

void setCompDefaults(jpeg_compress_struct *cinfo,int pixelFormat,int subsamp,int jpegQual,int flags)

{
  jpeg_component_info *pjVar1;
  int iVar2;
  undefined8 in_RAX;
  char *pcVar3;
  __int32_t **pp_Var4;
  int iVar5;
  J_COLOR_SPACE colorspace;
  int iVar6;
  uint uVar7;
  char tempc;
  int temp;
  undefined8 uStack_38;
  
  cinfo->in_color_space = pf2cs[pixelFormat];
  cinfo->input_components = tjPixelSize[pixelFormat];
  uStack_38 = in_RAX;
  jpeg_set_defaults(cinfo);
  pcVar3 = getenv("TJ_OPTIMIZE");
  if ((pcVar3 != (char *)0x0) && (*pcVar3 != '\0')) {
    iVar2 = strcmp(pcVar3,"1");
    if (iVar2 == 0) {
      cinfo->optimize_coding = 1;
    }
  }
  pcVar3 = getenv("TJ_ARITHMETIC");
  if ((pcVar3 != (char *)0x0) && (*pcVar3 != '\0')) {
    iVar2 = strcmp(pcVar3,"1");
    if (iVar2 == 0) {
      cinfo->arith_code = 1;
    }
  }
  pcVar3 = getenv("TJ_RESTART");
  if ((pcVar3 != (char *)0x0) && (*pcVar3 != '\0')) {
    uStack_38._0_4_ = (uint)uStack_38 & 0xffffff;
    uStack_38 = CONCAT44(0xffffffff,(uint)uStack_38);
    iVar2 = __isoc99_sscanf(pcVar3,"%d%c",(long)&uStack_38 + 4);
    uVar7 = uStack_38._4_4_;
    if (uStack_38._4_4_ < 0x10000 && 0 < iVar2) {
      pp_Var4 = __ctype_toupper_loc();
      if ((*pp_Var4)[uStack_38._3_1_] == 0x42) {
        cinfo->restart_interval = uVar7;
        uVar7 = 0;
      }
      cinfo->restart_in_rows = uVar7;
    }
  }
  if (-1 < jpegQual) {
    jpeg_set_quality(cinfo,jpegQual,1);
    cinfo->dct_method = (uint)(((uint)flags >> 0xc & 1) == 0 && jpegQual < 0x60);
  }
  colorspace = JCS_GRAYSCALE;
  if (subsamp != 3) {
    colorspace = (pixelFormat == 0xb) + 3 + (uint)(pixelFormat == 0xb);
  }
  jpeg_set_colorspace(cinfo,colorspace);
  if (((uint)flags >> 0xe & 1) == 0) {
    pcVar3 = getenv("TJ_PROGRESSIVE");
    if ((pcVar3 == (char *)0x0) || (*pcVar3 == '\0')) goto LAB_001370d7;
    iVar2 = strcmp(pcVar3,"1");
    if (iVar2 != 0) goto LAB_001370d7;
  }
  jpeg_simple_progression(cinfo);
LAB_001370d7:
  iVar2 = tjMCUWidth[subsamp];
  iVar6 = iVar2 + 7;
  if (-1 < iVar2) {
    iVar6 = iVar2;
  }
  pjVar1 = cinfo->comp_info;
  pjVar1->h_samp_factor = iVar6 >> 3;
  pjVar1[1].h_samp_factor = 1;
  pjVar1[2].h_samp_factor = 1;
  iVar2 = cinfo->num_components;
  if (3 < iVar2) {
    pjVar1[3].h_samp_factor = iVar6 >> 3;
  }
  iVar6 = tjMCUHeight[subsamp];
  iVar5 = iVar6 + 7;
  if (-1 < iVar6) {
    iVar5 = iVar6;
  }
  pjVar1->v_samp_factor = iVar5 >> 3;
  pjVar1[1].v_samp_factor = 1;
  pjVar1[2].v_samp_factor = 1;
  if (3 < iVar2) {
    pjVar1[3].v_samp_factor = iVar5 >> 3;
  }
  return;
}

Assistant:

static void setCompDefaults(struct jpeg_compress_struct *cinfo,
                            int pixelFormat, int subsamp, int jpegQual,
                            int flags)
{
#ifndef NO_GETENV
  char *env = NULL;
#endif

  cinfo->in_color_space = pf2cs[pixelFormat];
  cinfo->input_components = tjPixelSize[pixelFormat];
  jpeg_set_defaults(cinfo);

#ifndef NO_GETENV
  if ((env = getenv("TJ_OPTIMIZE")) != NULL && strlen(env) > 0 &&
      !strcmp(env, "1"))
    cinfo->optimize_coding = TRUE;
  if ((env = getenv("TJ_ARITHMETIC")) != NULL && strlen(env) > 0 &&
      !strcmp(env, "1"))
    cinfo->arith_code = TRUE;
  if ((env = getenv("TJ_RESTART")) != NULL && strlen(env) > 0) {
    int temp = -1;
    char tempc = 0;

    if (sscanf(env, "%d%c", &temp, &tempc) >= 1 && temp >= 0 &&
        temp <= 65535) {
      if (toupper(tempc) == 'B') {
        cinfo->restart_interval = temp;
        cinfo->restart_in_rows = 0;
      } else
        cinfo->restart_in_rows = temp;
    }
  }
#endif

  if (jpegQual >= 0) {
    jpeg_set_quality(cinfo, jpegQual, TRUE);
    if (jpegQual >= 96 || flags & TJFLAG_ACCURATEDCT)
      cinfo->dct_method = JDCT_ISLOW;
    else
      cinfo->dct_method = JDCT_FASTEST;
  }
  if (subsamp == TJSAMP_GRAY)
    jpeg_set_colorspace(cinfo, JCS_GRAYSCALE);
  else if (pixelFormat == TJPF_CMYK)
    jpeg_set_colorspace(cinfo, JCS_YCCK);
  else
    jpeg_set_colorspace(cinfo, JCS_YCbCr);

  if (flags & TJFLAG_PROGRESSIVE)
    jpeg_simple_progression(cinfo);
#ifndef NO_GETENV
  else if ((env = getenv("TJ_PROGRESSIVE")) != NULL && strlen(env) > 0 &&
           !strcmp(env, "1"))
    jpeg_simple_progression(cinfo);
#endif

  cinfo->comp_info[0].h_samp_factor = tjMCUWidth[subsamp] / 8;
  cinfo->comp_info[1].h_samp_factor = 1;
  cinfo->comp_info[2].h_samp_factor = 1;
  if (cinfo->num_components > 3)
    cinfo->comp_info[3].h_samp_factor = tjMCUWidth[subsamp] / 8;
  cinfo->comp_info[0].v_samp_factor = tjMCUHeight[subsamp] / 8;
  cinfo->comp_info[1].v_samp_factor = 1;
  cinfo->comp_info[2].v_samp_factor = 1;
  if (cinfo->num_components > 3)
    cinfo->comp_info[3].v_samp_factor = tjMCUHeight[subsamp] / 8;
}